

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotOperand.hpp
# Opt level: O0

NotOperand<ut11::Operands::IsStringBeginningWith> * __thiscall
ut11::detail::NotOperand<ut11::Operands::IsStringBeginningWith>::GetErrorMessage<char[6]>
          (NotOperand<ut11::Operands::IsStringBeginningWith> *this,char (*actual) [6])

{
  char *in_RDX;
  allocator local_79;
  string local_78 [32];
  IsStringBeginningWith local_58;
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char (*actual_local) [6];
  NotOperand<ut11::Operands::IsStringBeginningWith> *this_local;
  string *errorMessage;
  
  local_21 = 0;
  local_20 = in_RDX;
  actual_local = actual;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"Expected Not failed: \n",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_20,&local_79);
  Operands::IsStringBeginningWith::GetErrorMessage(&local_58,(string *)actual);
  std::__cxx11::string::operator+=((string *)this,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::string errorMessage("Expected Not failed: \n");
				errorMessage += operand.GetErrorMessage(actual);
				return errorMessage;
			}